

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v7::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args,locale_ref loc)

{
  short *pend;
  undefined1 value [16];
  undefined1 value_00 [16];
  buffer_appender<char> out;
  buffer_appender<char> out_00;
  bool bVar1;
  type tVar2;
  short *end;
  short *psVar3;
  short *pbegin;
  size_t sVar4;
  size_t __n;
  ulong uVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar7;
  basic_format_specs<char> specs;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  writer write;
  unkbyte10 in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff62;
  float local_98;
  undefined4 uStack_94;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  undefined1 local_88 [32];
  buffer_appender<char> local_68;
  char *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_58;
  locale_ref local_50;
  writer local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  aVar7 = args.field_1;
  pcVar6 = (char *)args.desc_;
  sVar4 = format_str.size_;
  pbegin = (short *)format_str.data_;
  if ((sVar4 != 2) || (*pbegin != 0x7d7b)) {
    local_88._24_8_ = local_88._24_8_ & 0xffffffff00000000;
    pend = (short *)((long)pbegin + sVar4);
    local_88._8_8_ = pbegin;
    local_88._16_8_ = sVar4;
    local_68.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)buf;
    local_60 = pcVar6;
    local_58 = aVar7;
    local_50.locale_ = loc.locale_;
    if (0x1f < (long)sVar4) {
      local_48.handler_ =
           (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            *)local_88;
      do {
        if (pbegin == pend) {
          return;
        }
        psVar3 = pbegin;
        if ((char)*pbegin == '{') {
LAB_001248da:
          parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
          ::writer::operator()(&local_48,(char *)pbegin,(char *)psVar3);
          pbegin = (short *)parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                                      ((char *)psVar3,(char *)pend,
                                       (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                        *)local_88);
          bVar1 = true;
        }
        else {
          __n = (long)pend - ((long)pbegin + 1);
          if ((long)__n < 0) {
            assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/core.h"
                        ,0x146,"negative value");
          }
          psVar3 = (short *)memchr((void *)((long)pbegin + 1),0x7b,__n);
          if (psVar3 != (short *)0x0) goto LAB_001248da;
          parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
          ::writer::operator()(&local_48,(char *)pbegin,(char *)pend);
          bVar1 = false;
        }
        if (!bVar1) {
          return;
        }
      } while( true );
    }
    if (sVar4 != 0) {
      psVar3 = pbegin;
      do {
        end = (short *)((long)psVar3 + 1);
        if ((char)*psVar3 == '}') {
          if ((end == pend) || (*(char *)end != '}')) {
            pcVar6 = "unmatched \'}\' in format string";
            goto LAB_00124ab9;
          }
          format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_88,(char *)pbegin,(char *)end);
          end = psVar3 + 1;
          pbegin = end;
        }
        else if ((char)*psVar3 == '{') {
          format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_88,(char *)pbegin,(char *)psVar3);
          end = (short *)parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                                   ((char *)psVar3,(char *)pend,
                                    (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                     *)local_88);
          pbegin = end;
        }
        psVar3 = end;
      } while (end != pend);
    }
    format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text((format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               *)local_88,(char *)pbegin,(char *)pend);
    return;
  }
  local_98 = 0.0;
  if ((long)pcVar6 < 0) {
    if ((int)(type)args.desc_ < 1) {
      tVar2 = none_type;
    }
    else {
      sVar4 = ((aVar7.values_)->field_0).string.size;
      local_98 = (float)((aVar7.values_)->field_0).long_long_value;
      uStack_94 = (undefined4)((ulong)((aVar7.values_)->field_0).long_long_value >> 0x20);
      uStack_90 = (undefined2)sVar4;
      uStack_8e = (undefined6)(sVar4 >> 0x10);
      tVar2 = (aVar7.args_)->type_;
    }
  }
  else {
    tVar2 = (type)args.desc_ & custom_type;
    if (((undefined1  [16])args & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
      sVar4 = ((aVar7.values_)->field_0).string.size;
      local_98 = (float)((aVar7.values_)->field_0).long_long_value;
      uStack_94 = (undefined4)((ulong)((aVar7.values_)->field_0).long_long_value >> 0x20);
      uStack_90 = (undefined2)sVar4;
      uStack_8e = (undefined6)(sVar4 >> 0x10);
    }
  }
  switch(tVar2) {
  case none_type:
    pcVar6 = "argument not found";
LAB_00124ab9:
    error_handler::on_error((error_handler *)local_88,pcVar6);
  case int_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
              ((buffer_appender<char>)buf,(int)local_98);
    break;
  case uint_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
              ((buffer_appender<char>)buf,(uint)local_98);
    break;
  case long_long_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
              ((buffer_appender<char>)buf,CONCAT44(uStack_94,local_98));
    break;
  case ulong_long_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
              ((buffer_appender<char>)buf,CONCAT44(uStack_94,local_98));
    break;
  case int128_type:
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ = uStack_94;
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ = local_98;
    value_00._10_6_ = in_stack_ffffffffffffff62;
    value_00._0_10_ = in_stack_ffffffffffffff58;
    write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
              ((detail *)buf,out_00,(__int128)value_00);
    break;
  case uint128_type:
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ = uStack_94;
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ = local_98;
    value._10_6_ = in_stack_ffffffffffffff62;
    value._0_10_ = in_stack_ffffffffffffff58;
    write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
              ((detail *)buf,out,(unsigned___int128)value);
    break;
  case bool_type:
    pcVar6 = "false";
    if (((uint)local_98 & 1) != 0) {
      pcVar6 = "true";
    }
    uVar5 = (ulong)((uint)local_98 & 1) ^ 5;
    goto LAB_00124a4b;
  case char_type:
    write<char,fmt::v7::detail::buffer_appender<char>>((buffer_appender<char>)buf,local_98._0_1_);
    break;
  case float_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
              ((buffer_appender<char>)buf,local_98);
    break;
  case double_type:
    write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
              ((buffer_appender<char>)buf,(double)CONCAT44(uStack_94,local_98));
    break;
  case last_numeric_type:
    specs.type = '\0';
    specs._9_1_ = 0;
    specs.fill.data_[0] = ' ';
    specs.fill.data_[1] = '\0';
    specs.fill.data_[2] = '\0';
    specs.fill.data_[3] = '\0';
    specs.fill.size_ = '\x01';
    specs._15_1_ = 0;
    specs.width = 0;
    specs.precision = -1;
    write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
              ((buffer_appender<char>)buf,
               (longdouble)CONCAT28(uStack_90,CONCAT44(uStack_94,local_98)),specs,(locale_ref)0x0);
    break;
  case cstring_type:
    write<char,fmt::v7::detail::buffer_appender<char>>
              ((buffer_appender<char>)buf,(char *)CONCAT44(uStack_94,local_98));
    break;
  case string_type:
    pcVar6 = (char *)CONCAT44(uStack_94,local_98);
    uVar5 = CONCAT62(uStack_8e,uStack_90);
LAB_00124a4b:
    buffer<char>::append<char>(buf,pcVar6,pcVar6 + uVar5);
    break;
  case pointer_type:
    write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
              ((buffer_appender<char>)buf,CONCAT44(uStack_94,local_98),
               (basic_format_specs<char> *)0x0);
    break;
  case custom_type:
    local_48.handler_ =
         (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)0x0;
    uStack_40 = 0;
    local_38 = 0;
    local_88._0_8_ = buf;
    local_88._8_8_ = pcVar6;
    local_88._16_8_ = aVar7;
    local_88._24_8_ = loc.locale_;
    (*(code *)CONCAT62(uStack_8e,uStack_90))(CONCAT44(uStack_94,local_98));
    break;
  default:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/format.h"
                ,0x7d7,"");
  }
  return;
}

Assistant:

void detail::vformat_to(
    detail::buffer<Char>& buf, basic_string_view<Char> format_str,
    basic_format_args<buffer_context<type_identity_t<Char>>> args,
    detail::locale_ref loc) {
  using iterator = typename buffer_context<Char>::iterator;
  auto out = buffer_appender<Char>(buf);
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<iterator, Char>{out, args, loc},
                     arg);
    return;
  }
  format_handler<iterator, Char, buffer_context<Char>> h(out, format_str, args,
                                                         loc);
  parse_format_string<false>(format_str, h);
}